

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::has_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  Meta *pMVar1;
  const_iterator cVar2;
  bool bVar3;
  ExtendedDecorations local_c;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,(ID)id);
  if (pMVar1 == (Meta *)0x0) {
    bVar3 = false;
  }
  else if (decoration < 0x40) {
    bVar3 = ((pMVar1->decoration).extended.flags.lower >> ((ulong)decoration & 0x3f) & 1) != 0;
  }
  else {
    local_c = decoration;
    cVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(pMVar1->decoration).extended.flags.higher._M_h,&local_c);
    bVar3 = cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0;
  }
  return bVar3;
}

Assistant:

bool Compiler::has_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &dec = m->decoration;
	return dec.extended.flags.get(decoration);
}